

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImRect ImGui::TableGetCellBgRect(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  float local_38;
  float local_34;
  float x2;
  float x1;
  ImGuiTableColumn *column;
  int column_n_local;
  ImGuiTable *table_local;
  
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  local_34 = pIVar1->MinX;
  local_38 = pIVar1->MaxX;
  if (pIVar1->PrevVisibleColumn == -1) {
    local_34 = local_34 - table->CellSpacingX1;
  }
  if (pIVar1->NextVisibleColumn == -1) {
    local_38 = table->CellSpacingX2 + local_38;
  }
  ImRect::ImRect((ImRect *)&table_local,local_34,table->RowPosY1,local_38,table->RowPosY2);
  return _table_local;
}

Assistant:

ImRect  ImGui::TableGetCellBgRect(const ImGuiTable* table, int column_n)
{
    const ImGuiTableColumn* column = &table->Columns[column_n];
    float x1 = column->MinX;
    float x2 = column->MaxX;
    if (column->PrevVisibleColumn == -1)
        x1 -= table->CellSpacingX1;
    if (column->NextVisibleColumn == -1)
        x2 += table->CellSpacingX2;
    return ImRect(x1, table->RowPosY1, x2, table->RowPosY2);
}